

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunnerMain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *str;
  long lVar1;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  Platform *platform_00;
  long lVar5;
  long lVar6;
  CommandLine cmdLine;
  UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> platform;
  DirArchive archive;
  TestRunner runner;
  
  cmdLine.runType.m_bits = 2;
  cmdLine.dstLogDir._M_dataplus._M_p = (pointer)&cmdLine.dstLogDir.field_2;
  cmdLine.dstLogDir._M_string_length = 0;
  cmdLine.dstLogDir.field_2._M_local_buf[0] = '\0';
  cmdLine.flags = 0;
  lVar6 = 1;
  do {
    if (argc <= lVar6) {
      platform_00 = createPlatform();
      platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data.ptr =
           platform_00;
      tcu::DirArchive::DirArchive(&archive,".");
      glcts::TestRunner::TestRunner
                (&runner,platform_00,&archive.super_Archive,cmdLine.dstLogDir._M_dataplus._M_p,
                 cmdLine.runType,cmdLine.flags);
      do {
        bVar2 = glcts::TestRunner::iterate(&runner);
      } while (bVar2);
      glcts::TestRunner::~TestRunner(&runner);
      tcu::DirArchive::~DirArchive(&archive);
      de::details::UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::~UniqueBase
                (&platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>);
      iVar4 = 0;
LAB_009126e6:
      std::__cxx11::string::~string((string *)&cmdLine.dstLogDir);
      return iVar4;
    }
    str = argv[lVar6];
    dVar3 = deStringBeginsWith(str,"--type=");
    if (dVar3 == 0) {
      dVar3 = deStringBeginsWith(str,"--logdir=");
      if (dVar3 == 0) {
        dVar3 = deStringBeginsWith(str,"--summary");
        if (dVar3 == 0) {
          dVar3 = deStringEqual(str,"--verbose");
          if (dVar3 == 0) {
LAB_0091268a:
            printf("%s:\n",*argv);
            puts("  --type=[esN[M]|glNM] Conformance test run type. Choose from");
            puts("                       ES: es2, es3, es31, es32");
            puts(
                "                       GL: gl30, gl31, gl32, gl33, gl40, gl41, gl42, gl43, gl44, gl45"
                );
            puts("  --logdir=[path]      Destination directory for log files");
            puts("  --summary            Print summary without running the tests");
            puts("  --verbose            Print out and log more information");
            iVar4 = -1;
            goto LAB_009126e6;
          }
          cmdLine.flags = 3;
        }
        else {
          cmdLine.flags = 8;
        }
      }
      else {
        std::__cxx11::string::assign((char *)&cmdLine.dstLogDir);
      }
    }
    else {
      if ((parseCommandLine(CommandLine&,int,char_const**)::runTypes == '\0') &&
         (iVar4 = __cxa_guard_acquire(&parseCommandLine(CommandLine&,int,char_const**)::runTypes),
         iVar4 != 0)) {
        parseCommandLine(CommandLine&,int,char_const**)::runTypes = "es2";
        DAT_01e82238 = 2;
        DAT_01e82240 = "es3";
        _DAT_01e82248 = 3;
        _DAT_01e82250 = "es31";
        _DAT_01e82258 = 0x13;
        _DAT_01e82260 = "es32";
        _DAT_01e82268 = 0x23;
        _DAT_01e82270 = "gl30";
        _DAT_01e82278 = 0x103;
        _DAT_01e82280 = "gl31";
        _DAT_01e82288 = 0x113;
        _DAT_01e82290 = "gl32";
        _DAT_01e82298 = 0x123;
        _DAT_01e822a0 = "gl33";
        _DAT_01e822a8 = 0x133;
        _DAT_01e822b0 = "gl40";
        _DAT_01e822b8 = 0x104;
        _DAT_01e822c0 = "gl41";
        _DAT_01e822c8 = 0x114;
        _DAT_01e822d0 = "gl42";
        _DAT_01e822d8 = 0x124;
        _DAT_01e822e0 = "gl43";
        _DAT_01e822e8 = 0x134;
        _DAT_01e822f0 = "gl44";
        _DAT_01e822f8 = 0x144;
        _DAT_01e82300 = "gl45";
        _DAT_01e82308 = 0x154;
        __cxa_guard_release(&parseCommandLine(CommandLine&,int,char_const**)::runTypes);
      }
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (lVar5 + 0x10 == 0xf0) goto LAB_0091268a;
        dVar3 = deStringEqual(*(char **)((long)&parseCommandLine(CommandLine&,int,char_const**)::
                                                runTypes + lVar5),str + 7);
        lVar1 = lVar5 + 0x10;
      } while (dVar3 == 0);
      cmdLine.runType.m_bits = *(deUint32 *)((long)&DAT_01e82238 + lVar5);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		de::UniquePtr<tcu::Platform> platform(createPlatform());
		tcu::DirArchive				 archive(".");
		glcts::TestRunner runner(static_cast<tcu::Platform&>(*platform.get()), archive, cmdLine.dstLogDir.c_str(),
								 cmdLine.runType, cmdLine.flags);

		for (;;)
		{
			if (!runner.iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		printf("ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}